

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgrid_main.cpp
# Opt level: O2

void printHelp(TypeHelp ht,TypeCommand com)

{
  runtime_error *this;
  char *pcVar1;
  
  if (ht == help_generic) {
    pcVar1 = 
    "\n    Usage: tasgrid <command> <option1> <value1> <option2> <value2> ...\n\nCommands                Shorthand    Action\n -help                  -h,--help    show verbose help options\n -version               -v,-info     show version and general info of enabled capabilities\n -log                                show the install log\n -cmakelog              -cmake       show the verbose list of cmake options\n -listtypes             -lt          list accepted grid types and 1-D rules\n -test                               perform a number of internal tests\n -makeglobal            -mg          make a grid from a global rule\n -makesequence          -ms          make a grid from a sequence rule\n -makelocalpoly         -mp          make a grid from a local polynomial rule\n -makewavelet           -mw          make a grid from a wavelet rule\n -makefourier           -mf          make a grid from a Fourier rule\n -makequadrature        -mq          make a quadrature\n -makeexoquad           -meq         make an exotic quadrature\n -makeupdate            -mu          updates an existing global/sequence/fourier grid\n -setconformal          -sc          set conformal domain transform\n -getquadrature         -gq          output quadrature weights and points\n -getinterweights       -gi          output the interpolation weights\n -getdiffweights        -gd          output the differentiation weights\n -getpoints             -gp          output the points\n -getneededpoints       -gn          outputs the points needing values to build an interpolant\n -loadvalues            -l           load the values of the interpolated function\n -evaluate              -e           evaluates the interpolant\n -evalhierarchyd        -ehd         evaluates the hierarchical basis (dense output)\n -evalhierarchys        -ehs         evaluates the hierarchical basis (sparse output)\n -gethsupport           -ghsup       get the hierarchical support\n -integrate             -i           output the integral\n -differentiate         -d           differentiates the interpol..." /* TRUNCATED STRING LITERAL */
    ;
  }
  else if (ht == help_listtypes) {
    pcVar1 = 
    "\nThis only lists the strings associated with each option for spelling purposes.\nRefer to the manual for details about each type.\n\nList of global grids types:\n  level     curved     hyperbolic     tensor\n  iptotal   ipcurved   iphyperbolic   iptensor\n  qptotal   qpcurved   qphyperbolic   qptensor\n\nList of global grids rules:\n         chebyshev          chebyshev-odd    clenshaw-curtis   clenshaw-curtis-zero\n              leja               leja-odd              rleja              rleja-odd\n     rleja-double2          rleja-double4      rleja-shifted     rleja-shifted-even\n      max-lebesgue       max-lebesgue-odd       min-lebesgue       min-lebesgue-odd\n         min-delta          min-delta-odd             fejer2\n    gauss-legendre     gauss-legendre-odd    gauss-patterson       custom-tabulated\n  gauss-gegenbauer   gauss-gegenbauer-odd       gauss-jacobi       gauss-jacobi-odd\n    gauss-laguerre     gauss-laguerre-odd      gauss-hermite      gauss-hermite-odd\n  gauss-chebyshev1   gauss-chebyshev1-odd   gauss-chebyshev2   gauss-chebyshev2-odd\n\nList of sequence grids rules:\n              leja              rleja     rleja-shifted\n      max-lebesgue       min-lebesgue         min-delta\n\nList of local polynomial grids rules:\n      localp    localp-zero    semi-localp   localp-boundary\n\nList of local wavelet grids rules:\n      wavelet\n\nList of local polynomial and wavelet refinement types:\n      classic     parents    direction    fds\n\nList of conformal maps:\n      asin\n\n"
    ;
  }
  else {
    if (ht != help_command) {
switchD_001131d4_default:
      return;
    }
    switch(com) {
    case command_none:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"ERROR: incorrect command for help");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case command_makeglobal:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -makeglobal         -mg          make a grid from a global rule\n\nAccepted options:\nOptions              Required     Value         Action\n -dimensions         yes          <int>         set the number of dimensions\n -outputs            yes          <int>         set the number of outputs\n -depth              yes          <int>         set the depth of the grid (e.g. levels)\n -type               yes          <type>        set the type of the grid\n -onedim             yes          <rule>        set the one dimensional rule\n                                                must use a global rule (see manual)\n -alpha              sometimes    <float>       the alpha parameter for Gegenbauer/Jacobi/Laguerre/Hermite quadrature\n                                                required for those rules\n -beta               sometimes    <float>       the beta parameter for Jacobi quadrature\n                                                required for Jacobi rule\n -gridfile           no           <filename>    set the name for the grid file\n -outputfile         no           <filename>    set the name for the output file\n -anisotropyfile     no           <filename>    set the anisotropic weights\n -transformfile      no           <filename>    set the transformation of the domain\n -customfile         sometimes    <filename>    set the file with the custom-tabulated rule\n -conformaltype      no           <type>        set the type of the map\n -conformalfile      no           <filename>    set the conformal transformation of the domain\n                                                required for custom-tabulated rule\n -levellimitsfile    no           <filename>    set the limits for the levels\n -print              no           <none>        print to standard output\n -ascii                           <none>        use ASCII grid file format\nNote: -outputfile or -print output the points of the grid\nNote: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the comma..." /* TRUNCATED STRING LITERAL */
      ;
      break;
    case command_makesequence:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -makesequence       -ms          make a grid from a sequence rule\n\nAccepted options:\nOptions              Required     Value         Action\n -dimensions         yes          <int>         set the number of dimensions\n -outputs            yes          <int>         set the number of outputs\n -depth              yes          <int>         set the depth of the grid (e.g. levels)\n -type               yes          <type>        set the type of the grid\n -onedim             yes          <rule>        set the one dimensional rule\n                                                must use a sequence rule (see manual)\n -gridfile           no           <filename>    set the name for the grid file\n -outputfile         no           <filename>    set the name for the output file\n -anisotropyfile     no           <filename>    set the anisotropic weights\n -transformfile      no           <filename>    set the transformation of the domain\n -conformaltype      no           <type>        set the type of the map\n -conformalfile      no           <filename>    set the conformal transformation of the domain\n -levellimitsfile    no           <filename>    set the limits for the levels\n -print              no           <none>        print to standard output\n -ascii                           <none>        use ASCII grid file format\nNote: -outputfile or -print output the points of the grid\nNote: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output\n"
      ;
      break;
    case command_makelocalp:
      pcVar1 = 
      "\nCommands            Shorthand    Action\n -makelocalpoly     -mp          make a grid from a local polynomial rule\n\nAccepted options:\nOptions             Required     Value         Action\n -dimensions        yes          <int>         set the number of dimensions\n -outputs           yes          <int>         set the number of outputs\n -depth             yes          <int>         set the depth of the grid (e.g. levels)\n -order             yes          <int>         set the order for local polynomial basis\n -onedim            yes          <rule>        set the one dimensional rule\n                                               must use a local polynomial rule (see manual)\n -gridfile          no           <filename>    set the name for the grid file\n -outputfile        no           <filename>    set the name for the output file\n -transformfile     no           <filename>    set the transformation of the domain\n -conformaltype     no           <type>        set the type of the map\n -conformalfile     no           <filename>    set the conformal transformation of the domain\n -levellimitsfile   no           <filename>    set the limits for the levels\n -print             no           <none>        print to standard output\n -ascii                          <none>        use ASCII grid file format\nNote: -outputfile or -print output the points of the grid\nNote: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_makewavelet:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -makewavelet        -mw          make a grid from a wavelet rule\n\nAccepted options:\nOptions              Required     Value         Action\n -dimensions         yes          <int>         set the number of dimensions\n -outputs            yes          <int>         set the number of outputs\n -depth              yes          <int>         set the depth of the grid (e.g. levels)\n -order              yes          <int>         set the order for the wavelet basis\n -gridfile           no           <filename>    set the name for the grid file\n -outputfile         no           <filename>    set the name for the output file\n -transformfile      no           <filename>    set the transformation of the domain\n -conformaltype      no           <type>        set the type of the map\n -conformalfile      no           <filename>    set the conformal transformation of the domain\n -levellimitsfile    no           <filename>    set the limits for the levels\n -print              no           <none>        print to standard output\n -ascii                           <none>        use ASCII grid file format\nNote: -outputfile or -print output the points of the grid\nNote: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_makefourier:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -makefourier        -mf          make a grid from a Fourier rule\n\nAccepted options:\nOptions              Required     Value         Action\n -dimensions         yes          <int>         set the number of dimensions\n -outputs            yes          <int>         set the number of outputs\n -depth              yes          <int>         set the depth of the grid (e.g. levels)\n -type               yes          <type>        set the type of the grid\n -gridfile           no           <filename>    set the name for the grid file\n -outputfile         no           <filename>    set the name for the output file\n -anisotropyfile     no           <filename>    set the anisotropic weights\n -transformfile      no           <filename>    set the transformation of the domain\n -conformaltype      no           <type>        set the type of the map\n -conformalfile      no           <filename>    set the conformal transformation of the domain\n -levellimitsfile    no           <filename>    set the limits for the levels\n -print              no           <none>        print to standard output\n -ascii                           <none>        use ASCII grid file format\nNote: -outputfile or -print output the points of the grid\nNote: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_makequadrature:
      pcVar1 = 
      "\nCommands            Shorthand    Action\n -makequadrature    -mq          make a quadrature\n\nAccepted options:\nOptions             Required     Value         Action\n -dimensions        yes          <int>         set the number of dimensions\n -depth             yes          <int>         set the depth of the grid (e.g. levels)\n -type              sometimes    <type>        set the type of the grid\n                                               required only for global rules (see manual)\n -order             sometimes    <int>         set the order for local polynomial basis\n                                               required only for local polynomial and wavelet (see manual)\n -onedim            yes          <rule>        set the one dimensional rule\n                                               can use any rule (see manual)\n -alpha             sometimes    <float>       the alpha parameter for Gegenbauer/Jacobi/Laguerre/Hermite quadrature\n                                               required for those rules\n -beta              sometimes    <float>       the beta parameter for Jacobi quadrature\n                                               required for Jacobi rule\n -outputfile        no           <filename>    set the name for the output file\n -anisotropyfile    no           <filename>    set the anisotropic weights\n -transformfile     no           <filename>    set the transformation of the domain\n -customfile        sometimes    <filename>    set the file with the custom-tabulated rule\n -conformaltype     no           <type>        set the type of the map\n -conformalfile     no           <filename>    set the conformal transformation of the domain\n                                               required for custom-tabulated rule\n -print             no           <none>        print to standard output\nNote: -outputfile or -print output the points and weights of the grid\nNote: at least one of -outputfile, or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_makeexoquad:
      pcVar1 = 
      "\nCommands         Shorthand    Action\n -makeexoquad    -meq         make an exotic quadrature\n\nAccepted options:\nOptions          Required     Value         Action\n -depth          yes          <int>         set the depth of the grid (e.g. levels)\n -shift          yes          <float>       set the shift of the weight function\n -weightfile     yes          <filename>    set the name of the file containing a\n                                            surrogate/interpolant of the weight function\n                                            must be a TasmanianSparseGrid in ASCII format\n -description    yes          <string>      short description of the quadrature\n -symmetric      no           <none>        declare that the weight function is symmetric   endl\n -outputfile     no           <filename>    set the name for the output file\n -print          no           <none>        print to standard output\nNote: -outputfile or -print output the points and weights of the grid\nNote: at least one of -outputfile, or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_update:
      pcVar1 = 
      "\nCommands            Shorthand    Action\n -makeupdate        -mu          updates a new global or sequence grid\n\nAccepted options:\nOptions             Required     Value         Action\n -depth             yes          <int>         set the depth of the grid (e.g. levels)\n -type              yes          <type>        set the type of the grid\n -anisotropyfile    no           <filename>    set the anisotropic weights\n -outputfile        no           <filename>    set the name for the output file\n -print             no           <none>        print to standard output\nNote: -outputfile or -print output the new points of the grid\n\n"
      ;
      break;
    case command_setconformal:
      pcVar1 = 
      "\nCommands           Shorthand    Action\n -setconformal     -sc          set conformal transformation\n\nAccepted options:\nOptions            Required     Value         Action\n -conformaltype    yes          <type>        set the type of the map\n -conformalfile    yes          <filename>    set the conformal transformation of the domain\n\n"
      ;
      break;
    case command_getquadrature:
      pcVar1 = 
      "\nCommands           Shorthand    Action\n -getquadrature    -gq          make a quadrature\n\nAccepted options:\nOptions            Required     Value         Action\n -gridfile         yes          <filename>    set the name for the grid file\n -outputfile       no           <filename>    set the name for the output file\n -print            no           <none>        print to standard output\nNote: -outputfile or -print output the points and weights of the grid\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_getinterweights:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -getinterweights    -gi          output the interpolation weights\n\nAccepted options:\nOptions              Required     Value         Action\n -gridfile           yes          <filename>    set the name for the grid file\n -xfile              yes          <filename>    set the name for the file with points\n -outputfile         no           <filename>    set the name for the output file\n -print              no           <none>        print to standard output\nNote: -outputfile or -print output the interpolation weight for each point in the xfile, see equation (1.2) in the manual\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_getdiffweights:
      pcVar1 = 
      "\nCommands            Shorthand    Action\n -getdiffweights    -gd          output the differentiation weights\n\nAccepted options:\nOptions             Required     Value         Action\n -gridfile          yes          <filename>    set the name for the grid file\n -xfile             yes          <filename>    set the name for the file with points\n -outputfile        no           <filename>    set the name for the output file\n -print             no           <none>        print to standard output\nNote: -outputfile or -print output the differentiation weight for each point in the xfile\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_getpoints:
      pcVar1 = 
      "\nCommands        Shorthand    Action\n -getpoints     -gp          output the points\n\nAccepted options:\nOptions         Required     Value         Action\n -gridfile      yes          <filename>    set the name for the grid file\n -outputfile    no           <filename>    set the name for the output file\n -print         no           <none>        print to standard output\nNote: -outputfile or -print output the points of the grid\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_getneeded:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -getneededpoints    -gn          outputs the points needing values to build an interpolant\n\nAccepted options:\nOptions              Required     Value         Action\n -gridfile           yes          <filename>    set the name for the grid file\n -outputfile         no           <filename>    set the name for the output file\n -print              no           <none>        print to standard output\nNote: -outputfile or -print output the new points of the grid\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_loadvalues:
      pcVar1 = 
      "\nCommands        Shorthand    Action\n -loadvalues    -l           provides values of the model outputs at the needed grid points\n\nAccepted options:\nOptions         Required     Value         Action\n -gridfile      yes          <filename>    set the name for the grid file\n -valsfile      -vf          <filename>    set the name for the file with values\nNote: the -valsfile must contains rows equal to the number of needed points or\n      (if there are no needed points) the number of loaded points\n      the number of columns must match the number of outputs set for the grid\n\n"
      ;
      break;
    case command_evaluate:
      pcVar1 = 
      "\nCommands        Shorthand    Action\n -evaluate      -e           evaluates the interpolant\n\nAccepted options:\nOptions         Required     Value         Action\n -gridfile      yes          <filename>    set the name for the grid file\n -xfile         yes          <filename>    set the name for the file with points\n -gpuid         no           <int>         set the gpu to use for evaluations\n -outputfile    no           <filename>    set the name for the output file\n -print         no           <none>        print to standard output\nNote: -outputfile or -print output values of the interpolant at the points specified in the xfile\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_integrate:
      pcVar1 = 
      "\nCommands        Shorthand    Action\n -integrate     -i           output the integral\n\nAccepted options:\nOptions         Required     Value         Action\n -gridfile      yes          <filename>    set the name for the grid file\n -outputfile    no           <filename>    set the name for the output file\n -print         no           <none>        print to standard output\nNote: -outputfile or -print output the integral if the loaded function, see equation (1.3) in the manual\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_differentiate:
      pcVar1 = 
      "\nCommands           Shorthand    Action\n -differentiate    -d           differentiates the interpolant\n\nAccepted options:\nOptions            Required     Value         Action\n -gridfile         yes          <filename>    set the name for the grid file\n -xfile            yes          <filename>    set the name for the file with points\n -outputfile       no           <filename>    set the name for the output file\n -print            no           <none>        print to standard output\nNote: -outputfile or -print derivative (Jacobian matrix) of the interpolant at the points specified in the xfile\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_getanisocoeff:
      pcVar1 = 
      "\nCommands           Shorthand    Action\n -getanisotropy    -ga          estimates the anisotropic coefficients\n\nAccepted options:\nOptions            Required     Value         Action\n -gridfile         yes          <filename>    set the name for the grid file\n -type             yes          <type>        set the type of anisotropic coefficients\n -refout           sometimes    <int>         select the output to use\n                                              required by global grids only\n -outputfile       no           <filename>    set the name for the output file\n -print            no           <none>        print to standard output\nNote: -outputfile or -print output the estimated anisotropic coefficients\n\n"
      ;
      break;
    case command_refine_surp:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -refinesurp         -rs          refines the grid\n\nAccepted options:\nOptions              Required     Value     Action\n -gridfile           yes          <filename>    set the name for the grid file\n -tolerance          yes          <float>       set the tolerance for the refinement\n -reftype            sometimes    <int>         set the type of refinement\n                                                required by local polynomial and wavelet grids\n -refout             sometimes    <int>         select the output to use for the refinement\n                                                required by global grids, for sequence grids\n                                                defaults to -1 (use all outputs)\n -levellimitsfile    no           <filename>    set the limits for the levels\n -valsfile           no           <filename>    set the correction weights for the surpluses\n -outputfile         no           <filename>    set the name for the output file\n -print              no           <none>        print to standard output\n -ascii                           <none>        use ASCII grid file format\nNote: -outputfile or -print output the new points of the grid\n\n"
      ;
      break;
    case command_refine_aniso:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -refineaniso        -ra          refines the grid\n\nAccepted options:\nOptions              Required     Value         Action\n -gridfile           yes          <filename>    set the name for the grid file\n -type               yes          <type>        set the type of anisotropic refinement\n -mingrowth          no           <int>         minimum number of new points (defaults to 1)\n -refout             sometimes    <int>         select the output to use for the refinement\n                                                required by global grids, for sequence grids\n                                                defaults to -1 (use all outputs)\n -levellimitsfile    no           <filename>    set the limits for the levels\n -outputfile         no           <filename>    set the name for the output file\n -print              no           <none>        print to standard output\n -ascii              <none>       use ASCII grid file format\nNote: -outputfile or -print output the new points of the grid\n\n"
      ;
      break;
    case command_refine:
      pcVar1 = 
      "\nCommands      Shorthand    Action\n -refine      -r     refines the grid\n\n -refine calls -refineaniso for Global and Sequence grids and -refinesurp otherwise\n see \"-refineaniso help\" or \"-refinesurp help\" for the corresponding accepted options\nNote: -outputfile or -print output the new points of the grid\n\n"
      ;
      break;
    case command_refine_clear:
      pcVar1 = 
      "\nCommands          Shorthand    Action\n -cancelrefine    -cr          discards the last refinement (unless values are already loaded)\nAccepted options:\nOptions           Required     Value         Action\n -gridfile        yes          <filename>    set the name for the grid file\n -ascii                        <none>        use ASCII grid file format\n\n"
      ;
      break;
    case command_refine_merge:
      pcVar1 = 
      "\nCommands         Shorthand    Action\n -mergerefine    -mr          merges the loaded and needed points and discards any loaded values\n\nAccepted options:\nOptions          Required     Value         Action\n    -gridfile    yes          <filename>    set the name for the grid file\n    -ascii       <none>       use ASCII grid file format\n\n"
      ;
      break;
    case command_using_construct:
      pcVar1 = 
      "\nCommands             Action\n -using-construct    writes short string indicating whether dynamic construction is on\n\nAccepted options:\nOptions       Required     Value         Action\n -gridfile    yes          <filename>    set the name for the grid file\nNote that \'tasgrid -using-construct <filename>\' is also accepted\n\n"
      ;
      break;
    case command_get_candidate_construction:
      pcVar1 = 
      "\nCommands              Shorthand    Action\n -getconstructpnts    -gcp         get points for dynamic construction\n\nAccepted options:\nOptions               Required     Value         Action\n -gridfile            yes          <filename>    set the name for the grid file\n -refout              sometimes    <int>         select the output to use for the refinement\n -anisotropyfile      sometimes    <filename>    set the anisotropic weights\n -levellimitsfile     no           <filename>    set the limits for the levels\n -outputfile          no           <filename>    set the name for the output file\n -print               no           <none>        print to standard output\n -ascii                            <none>        use ASCII grid file format\n\n"
      ;
      break;
    case command_load_construction:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -loadconstructed    -lcp         load points for dynamic construction\n\nAccepted options:\nOptions              Required     Value         Action\n -gridfile           yes          <filename>    set the name for the grid file\n -xfile              yes          <filename>    set the name for the file with points\n -valsfile           yes          <filename>    set the name for the file with values\n\n"
      ;
      break;
    case command_getpoly:
      pcVar1 = 
      "\nCommands        Shorthand    Action\n -getpoly                    get polynomial space\n\nAccepted options:\nOptions         Required     Value         Action\n -gridfile      yes          <filename>    set the name for the grid file\n -type          yes          <type>        specifies whether to use quadrature or interpolation\n -outputfile    no           <filename>    set the name for the output file\n -print         no           <none>        print to standard output\nNote: -outputfile or -print output the polynomial indexes\n\n"
      ;
      break;
    case command_summary:
      pcVar1 = 
      "\nCommands      Shorthand    Action\n -summary     -s           writes short description\n\nAccepted options:\nOptions       Required     Value         Action\n -gridfile    yes          <filename>    set the name for the grid file\nNote that \'tasgrid -s <filename>\' is also accepted\n\n"
      ;
      break;
    case command_getcoefficients:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -getcoefficients    -gc          get the hierarchical coefficients\n\nAccepted options:\nOptions              Required     Value         Action\n -gridfile           yes          <filename>    set the name for the grid file\n -outputfile         no           <filename>    set the name for the output file\n -print              no           <none>        print to standard output\nNote: -outputfile or -print output the hierarchical coefficients of the sparse grid\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_setcoefficients:
      pcVar1 = 
      "\nCommands             Shorthand    Action\n -setcoefficients    -sc          set the hierarchical coefficients\n\nAccepted options:\nOptions              Required     Value         Action\n -gridfile           yes          <filename>    set the name for the grid file\n -outputfile         no           <filename>    set the name for the output file\n -print              no           <none>        print to standard output\nNote: -outputfile or -print output the hierarchical coefficients of the sparse grid\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_evalhierarchical_sparse:
      pcVar1 = 
      "\nCommands            Shorthand    Action\n -evalhierarchys    -ehs         evaluates the hierarchical basis (sparse output)\n\nAccepted options:\nOptions             Required     Value         Action\n -gridfile          yes          <filename>    set the name for the grid file\n -xfile             yes          <filename>    set the name for the file with points\n -outputfile        no           <filename>    set the name for the output file\n -print             no           <none>        print to standard output\nNote: -outputfile or -print output values of the hierarchical basis functions in the xfile\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_evalhierarchical_dense:
      pcVar1 = 
      "\nCommands            Shorthand    Action\n -evalhierarchyd    -ehd         evaluates the hierarchical basis (dense output)\n\nAccepted options:\nOptions             Required     Value         Action\n -gridfile          yes          <filename>    set the name for the grid file\n -xfile             yes          <filename>    set the name for the file with points\n -outputfile        no           <filename>    set the name for the output file\n -print             no           <none>        print to standard output\nNote: -outputfile or -print output values of the hierarchical basis functions in the xfile\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_gethsupport:
      pcVar1 = 
      "\nCommands         Shorthand    Action\n -gethsupport    -ghsup       get the hierarchical support\n\nAccepted options:\nOptions          Required     Value         Action\n -gridfile       yes          <filename>    set the name for the grid file\n -outputfile     no           <filename>    set the name for the output file\n -print          no           <none>        print to standard output\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    case command_getpointsindex:
    case command_getneededindex:
      pcVar1 = 
      "\nCommands              Action\n -getpointsindexes    returns the integer multi-index set of the points\n -getneededindexes    returns the integer multi-index set of the needed points\nNote: these commands exist primarily for debugging purposes\n\nAccepted options:\nOptions         Required     Value         Action\n -gridfile      yes          <filename>    set the name for the grid file\n -outputfile    no           <filename>    set the name for the output file\n -print         no           <none>        print to standard output\nNote: -outputfile or -print derivative (Jacobian matrix) of the interpolant at the points specified in the xfile\nNote: at least one of -outputfile or -print must be specified, otherwise the command has no output\n\n"
      ;
      break;
    default:
      goto switchD_001131d4_default;
    }
  }
  std::operator<<((ostream *)&std::cout,pcVar1);
  return;
}

Assistant:

void printHelp(TypeHelp ht, TypeCommand com){

    if (ht == help_generic){
        cout << R"help(
    Usage: tasgrid <command> <option1> <value1> <option2> <value2> ...

Commands                Shorthand    Action
 -help                  -h,--help    show verbose help options
 -version               -v,-info     show version and general info of enabled capabilities
 -log                                show the install log
 -cmakelog              -cmake       show the verbose list of cmake options
 -listtypes             -lt          list accepted grid types and 1-D rules
 -test                               perform a number of internal tests
 -makeglobal            -mg          make a grid from a global rule
 -makesequence          -ms          make a grid from a sequence rule
 -makelocalpoly         -mp          make a grid from a local polynomial rule
 -makewavelet           -mw          make a grid from a wavelet rule
 -makefourier           -mf          make a grid from a Fourier rule
 -makequadrature        -mq          make a quadrature
 -makeexoquad           -meq         make an exotic quadrature
 -makeupdate            -mu          updates an existing global/sequence/fourier grid
 -setconformal          -sc          set conformal domain transform
 -getquadrature         -gq          output quadrature weights and points
 -getinterweights       -gi          output the interpolation weights
 -getdiffweights        -gd          output the differentiation weights
 -getpoints             -gp          output the points
 -getneededpoints       -gn          outputs the points needing values to build an interpolant
 -loadvalues            -l           load the values of the interpolated function
 -evaluate              -e           evaluates the interpolant
 -evalhierarchyd        -ehd         evaluates the hierarchical basis (dense output)
 -evalhierarchys        -ehs         evaluates the hierarchical basis (sparse output)
 -gethsupport           -ghsup       get the hierarchical support
 -integrate             -i           output the integral
 -differentiate         -d           differentiates the interpolant
 -getanisotropy         -ga          estimates the anisotropic coefficients
 -refineaniso           -ra          refines the grid
 -refinesurp            -rs          refines the grid
 -refine                -r           refines the grid
 -cancelrefine          -cr          discards the last refinement (unless values are already loaded)
 -mergerefine           -mr          combines the loaded and needed points and discards the loaded values
 -using-construct                    prints simple string indicating whether dynamic construction is in use
 -getconstructpnts      -gcp         get points for dynamic construction
 -loadconstructed       -lcp         load points for dynamic construction
 -getcoefficients       -gc          get the hierarchical coefficients of the grid
 -setcoefficients       -sc          set the hierarchical coefficients of the grid
 -getpoly                            get polynomial space
 -summary               -s           writes short description

Options                 Shorthand  Value         Action
 -help                  help                     display verbose information about this command
 -dimensions            -dim       <int>         set the number of dimensions
 -outputs               -out       <int>         set the number of outputs
 -depth                 -dt        <int>         set the depth of the grid (e.g. levels)
 -type                  -tt        <type>        set the type of the grid
 -conformaltype         -tt        <type>        set the type of the transformation
 -onedim                -1d        <rule>        set the one dimensional rule
 -order                 -or        <int>         set the order for local polynomial and wavelet basis
 -alpha                            <float>       the alpha parameter for Gegenbauer/Jacobi/Laguerre/Hermite quadrature
 -beta                             <float>       the beta parameter for Jacobi quadrature
 -tolerance             -tol       <float>       set the tolerance for the refinement
 -refout                -rout      <int>         select the output to use for the refinement
 -mingrowth             -ming      <int>         minimum number of new points
 -reftype               -rt        <int>         set the type of refinement

 -gridfile              -gf        <filename>    set the name for the grid file
 -xfile                 -xf        <filename>    set the name for the file with points
 -valsfile              -vf        <filename>    set the name for the file with values
 -outputfile            -of        <filename>    set the name for the output file
 -anisotropyfile        -af        <filename>    set the anisotropic weights
 -transformfile         -tf        <filename>    set the transformation of the domain
 -conformalfile         -tf        <filename>    set the conformal transformation of the domain
 -levellimitsfile       -lf        <filename>    set the limits for the levels
 -customfile            -cf        <filename>    set the file with the custom-tabulated rule
 -gpuid                            <int>         set the gpu to use for evaluations
 -print                 -p         <none>        print to standard output
 -ascii                            <none>        use ASCII grid file format

)help";
    }else if (ht == help_command){
        switch(com){
            case command_makeglobal:
                cout << R"help(
Commands             Shorthand    Action
 -makeglobal         -mg          make a grid from a global rule

Accepted options:
Options              Required     Value         Action
 -dimensions         yes          <int>         set the number of dimensions
 -outputs            yes          <int>         set the number of outputs
 -depth              yes          <int>         set the depth of the grid (e.g. levels)
 -type               yes          <type>        set the type of the grid
 -onedim             yes          <rule>        set the one dimensional rule
                                                must use a global rule (see manual)
 -alpha              sometimes    <float>       the alpha parameter for Gegenbauer/Jacobi/Laguerre/Hermite quadrature
                                                required for those rules
 -beta               sometimes    <float>       the beta parameter for Jacobi quadrature
                                                required for Jacobi rule
 -gridfile           no           <filename>    set the name for the grid file
 -outputfile         no           <filename>    set the name for the output file
 -anisotropyfile     no           <filename>    set the anisotropic weights
 -transformfile      no           <filename>    set the transformation of the domain
 -customfile         sometimes    <filename>    set the file with the custom-tabulated rule
 -conformaltype      no           <type>        set the type of the map
 -conformalfile      no           <filename>    set the conformal transformation of the domain
                                                required for custom-tabulated rule
 -levellimitsfile    no           <filename>    set the limits for the levels
 -print              no           <none>        print to standard output
 -ascii                           <none>        use ASCII grid file format
Note: -outputfile or -print output the points of the grid
Note: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output
)help";
                break;
            case command_makesequence:
                cout << R"help(
Commands             Shorthand    Action
 -makesequence       -ms          make a grid from a sequence rule

Accepted options:
Options              Required     Value         Action
 -dimensions         yes          <int>         set the number of dimensions
 -outputs            yes          <int>         set the number of outputs
 -depth              yes          <int>         set the depth of the grid (e.g. levels)
 -type               yes          <type>        set the type of the grid
 -onedim             yes          <rule>        set the one dimensional rule
                                                must use a sequence rule (see manual)
 -gridfile           no           <filename>    set the name for the grid file
 -outputfile         no           <filename>    set the name for the output file
 -anisotropyfile     no           <filename>    set the anisotropic weights
 -transformfile      no           <filename>    set the transformation of the domain
 -conformaltype      no           <type>        set the type of the map
 -conformalfile      no           <filename>    set the conformal transformation of the domain
 -levellimitsfile    no           <filename>    set the limits for the levels
 -print              no           <none>        print to standard output
 -ascii                           <none>        use ASCII grid file format
Note: -outputfile or -print output the points of the grid
Note: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output
)help";
                break;
            case command_makelocalp:
                cout << R"help(
Commands            Shorthand    Action
 -makelocalpoly     -mp          make a grid from a local polynomial rule

Accepted options:
Options             Required     Value         Action
 -dimensions        yes          <int>         set the number of dimensions
 -outputs           yes          <int>         set the number of outputs
 -depth             yes          <int>         set the depth of the grid (e.g. levels)
 -order             yes          <int>         set the order for local polynomial basis
 -onedim            yes          <rule>        set the one dimensional rule
                                               must use a local polynomial rule (see manual)
 -gridfile          no           <filename>    set the name for the grid file
 -outputfile        no           <filename>    set the name for the output file
 -transformfile     no           <filename>    set the transformation of the domain
 -conformaltype     no           <type>        set the type of the map
 -conformalfile     no           <filename>    set the conformal transformation of the domain
 -levellimitsfile   no           <filename>    set the limits for the levels
 -print             no           <none>        print to standard output
 -ascii                          <none>        use ASCII grid file format
Note: -outputfile or -print output the points of the grid
Note: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_makewavelet:
                cout << R"help(
Commands             Shorthand    Action
 -makewavelet        -mw          make a grid from a wavelet rule

Accepted options:
Options              Required     Value         Action
 -dimensions         yes          <int>         set the number of dimensions
 -outputs            yes          <int>         set the number of outputs
 -depth              yes          <int>         set the depth of the grid (e.g. levels)
 -order              yes          <int>         set the order for the wavelet basis
 -gridfile           no           <filename>    set the name for the grid file
 -outputfile         no           <filename>    set the name for the output file
 -transformfile      no           <filename>    set the transformation of the domain
 -conformaltype      no           <type>        set the type of the map
 -conformalfile      no           <filename>    set the conformal transformation of the domain
 -levellimitsfile    no           <filename>    set the limits for the levels
 -print              no           <none>        print to standard output
 -ascii                           <none>        use ASCII grid file format
Note: -outputfile or -print output the points of the grid
Note: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_makefourier:
                cout << R"help(
Commands             Shorthand    Action
 -makefourier        -mf          make a grid from a Fourier rule

Accepted options:
Options              Required     Value         Action
 -dimensions         yes          <int>         set the number of dimensions
 -outputs            yes          <int>         set the number of outputs
 -depth              yes          <int>         set the depth of the grid (e.g. levels)
 -type               yes          <type>        set the type of the grid
 -gridfile           no           <filename>    set the name for the grid file
 -outputfile         no           <filename>    set the name for the output file
 -anisotropyfile     no           <filename>    set the anisotropic weights
 -transformfile      no           <filename>    set the transformation of the domain
 -conformaltype      no           <type>        set the type of the map
 -conformalfile      no           <filename>    set the conformal transformation of the domain
 -levellimitsfile    no           <filename>    set the limits for the levels
 -print              no           <none>        print to standard output
 -ascii                           <none>        use ASCII grid file format
Note: -outputfile or -print output the points of the grid
Note: at least one of -gridfile, -outputfile, or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_makequadrature:
                cout << R"help(
Commands            Shorthand    Action
 -makequadrature    -mq          make a quadrature

Accepted options:
Options             Required     Value         Action
 -dimensions        yes          <int>         set the number of dimensions
 -depth             yes          <int>         set the depth of the grid (e.g. levels)
 -type              sometimes    <type>        set the type of the grid
                                               required only for global rules (see manual)
 -order             sometimes    <int>         set the order for local polynomial basis
                                               required only for local polynomial and wavelet (see manual)
 -onedim            yes          <rule>        set the one dimensional rule
                                               can use any rule (see manual)
 -alpha             sometimes    <float>       the alpha parameter for Gegenbauer/Jacobi/Laguerre/Hermite quadrature
                                               required for those rules
 -beta              sometimes    <float>       the beta parameter for Jacobi quadrature
                                               required for Jacobi rule
 -outputfile        no           <filename>    set the name for the output file
 -anisotropyfile    no           <filename>    set the anisotropic weights
 -transformfile     no           <filename>    set the transformation of the domain
 -customfile        sometimes    <filename>    set the file with the custom-tabulated rule
 -conformaltype     no           <type>        set the type of the map
 -conformalfile     no           <filename>    set the conformal transformation of the domain
                                               required for custom-tabulated rule
 -print             no           <none>        print to standard output
Note: -outputfile or -print output the points and weights of the grid
Note: at least one of -outputfile, or -print must be specified, otherwise the command has no output

)help";
                break;

            case command_makeexoquad:
                cout << R"help(
Commands         Shorthand    Action
 -makeexoquad    -meq         make an exotic quadrature

Accepted options:
Options          Required     Value         Action
 -depth          yes          <int>         set the depth of the grid (e.g. levels)
 -shift          yes          <float>       set the shift of the weight function
 -weightfile     yes          <filename>    set the name of the file containing a
                                            surrogate/interpolant of the weight function
                                            must be a TasmanianSparseGrid in ASCII format
 -description    yes          <string>      short description of the quadrature
 -symmetric      no           <none>        declare that the weight function is symmetric   endl
 -outputfile     no           <filename>    set the name for the output file
 -print          no           <none>        print to standard output
Note: -outputfile or -print output the points and weights of the grid
Note: at least one of -outputfile, or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_update:
                cout << R"help(
Commands            Shorthand    Action
 -makeupdate        -mu          updates a new global or sequence grid

Accepted options:
Options             Required     Value         Action
 -depth             yes          <int>         set the depth of the grid (e.g. levels)
 -type              yes          <type>        set the type of the grid
 -anisotropyfile    no           <filename>    set the anisotropic weights
 -outputfile        no           <filename>    set the name for the output file
 -print             no           <none>        print to standard output
Note: -outputfile or -print output the new points of the grid

)help";
                break;
            case command_setconformal:
                cout << R"help(
Commands           Shorthand    Action
 -setconformal     -sc          set conformal transformation

Accepted options:
Options            Required     Value         Action
 -conformaltype    yes          <type>        set the type of the map
 -conformalfile    yes          <filename>    set the conformal transformation of the domain

)help";
                break;
            case command_getquadrature:
                cout << R"help(
Commands           Shorthand    Action
 -getquadrature    -gq          make a quadrature

Accepted options:
Options            Required     Value         Action
 -gridfile         yes          <filename>    set the name for the grid file
 -outputfile       no           <filename>    set the name for the output file
 -print            no           <none>        print to standard output
Note: -outputfile or -print output the points and weights of the grid
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_getcoefficients:
                cout << R"help(
Commands             Shorthand    Action
 -getcoefficients    -gc          get the hierarchical coefficients

Accepted options:
Options              Required     Value         Action
 -gridfile           yes          <filename>    set the name for the grid file
 -outputfile         no           <filename>    set the name for the output file
 -print              no           <none>        print to standard output
Note: -outputfile or -print output the hierarchical coefficients of the sparse grid
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_setcoefficients:
                cout << R"help(
Commands             Shorthand    Action
 -setcoefficients    -sc          set the hierarchical coefficients

Accepted options:
Options              Required     Value         Action
 -gridfile           yes          <filename>    set the name for the grid file
 -outputfile         no           <filename>    set the name for the output file
 -print              no           <none>        print to standard output
Note: -outputfile or -print output the hierarchical coefficients of the sparse grid
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_getinterweights:
                cout << R"help(
Commands             Shorthand    Action
 -getinterweights    -gi          output the interpolation weights

Accepted options:
Options              Required     Value         Action
 -gridfile           yes          <filename>    set the name for the grid file
 -xfile              yes          <filename>    set the name for the file with points
 -outputfile         no           <filename>    set the name for the output file
 -print              no           <none>        print to standard output
Note: -outputfile or -print output the interpolation weight for each point in the xfile, see equation (1.2) in the manual
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_getdiffweights:
                cout << R"help(
Commands            Shorthand    Action
 -getdiffweights    -gd          output the differentiation weights

Accepted options:
Options             Required     Value         Action
 -gridfile          yes          <filename>    set the name for the grid file
 -xfile             yes          <filename>    set the name for the file with points
 -outputfile        no           <filename>    set the name for the output file
 -print             no           <none>        print to standard output
Note: -outputfile or -print output the differentiation weight for each point in the xfile
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_getpoints:
                cout << R"help(
Commands        Shorthand    Action
 -getpoints     -gp          output the points

Accepted options:
Options         Required     Value         Action
 -gridfile      yes          <filename>    set the name for the grid file
 -outputfile    no           <filename>    set the name for the output file
 -print         no           <none>        print to standard output
Note: -outputfile or -print output the points of the grid
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_getneeded:
                cout << R"help(
Commands             Shorthand    Action
 -getneededpoints    -gn          outputs the points needing values to build an interpolant

Accepted options:
Options              Required     Value         Action
 -gridfile           yes          <filename>    set the name for the grid file
 -outputfile         no           <filename>    set the name for the output file
 -print              no           <none>        print to standard output
Note: -outputfile or -print output the new points of the grid
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_loadvalues:
                cout << R"help(
Commands        Shorthand    Action
 -loadvalues    -l           provides values of the model outputs at the needed grid points

Accepted options:
Options         Required     Value         Action
 -gridfile      yes          <filename>    set the name for the grid file
 -valsfile      -vf          <filename>    set the name for the file with values
Note: the -valsfile must contains rows equal to the number of needed points or
      (if there are no needed points) the number of loaded points
      the number of columns must match the number of outputs set for the grid

)help";
                break;
            case command_evaluate:
                cout << R"help(
Commands        Shorthand    Action
 -evaluate      -e           evaluates the interpolant

Accepted options:
Options         Required     Value         Action
 -gridfile      yes          <filename>    set the name for the grid file
 -xfile         yes          <filename>    set the name for the file with points
 -gpuid         no           <int>         set the gpu to use for evaluations
 -outputfile    no           <filename>    set the name for the output file
 -print         no           <none>        print to standard output
Note: -outputfile or -print output values of the interpolant at the points specified in the xfile
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_evalhierarchical_dense:
                cout << R"help(
Commands            Shorthand    Action
 -evalhierarchyd    -ehd         evaluates the hierarchical basis (dense output)

Accepted options:
Options             Required     Value         Action
 -gridfile          yes          <filename>    set the name for the grid file
 -xfile             yes          <filename>    set the name for the file with points
 -outputfile        no           <filename>    set the name for the output file
 -print             no           <none>        print to standard output
Note: -outputfile or -print output values of the hierarchical basis functions in the xfile
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_evalhierarchical_sparse:
                cout << R"help(
Commands            Shorthand    Action
 -evalhierarchys    -ehs         evaluates the hierarchical basis (sparse output)

Accepted options:
Options             Required     Value         Action
 -gridfile          yes          <filename>    set the name for the grid file
 -xfile             yes          <filename>    set the name for the file with points
 -outputfile        no           <filename>    set the name for the output file
 -print             no           <none>        print to standard output
Note: -outputfile or -print output values of the hierarchical basis functions in the xfile
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_gethsupport:
                cout << R"help(
Commands         Shorthand    Action
 -gethsupport    -ghsup       get the hierarchical support

Accepted options:
Options          Required     Value         Action
 -gridfile       yes          <filename>    set the name for the grid file
 -outputfile     no           <filename>    set the name for the output file
 -print          no           <none>        print to standard output
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_integrate:
                cout << R"help(
Commands        Shorthand    Action
 -integrate     -i           output the integral

Accepted options:
Options         Required     Value         Action
 -gridfile      yes          <filename>    set the name for the grid file
 -outputfile    no           <filename>    set the name for the output file
 -print         no           <none>        print to standard output
Note: -outputfile or -print output the integral if the loaded function, see equation (1.3) in the manual
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_differentiate:
                cout << R"help(
Commands           Shorthand    Action
 -differentiate    -d           differentiates the interpolant

Accepted options:
Options            Required     Value         Action
 -gridfile         yes          <filename>    set the name for the grid file
 -xfile            yes          <filename>    set the name for the file with points
 -outputfile       no           <filename>    set the name for the output file
 -print            no           <none>        print to standard output
Note: -outputfile or -print derivative (Jacobian matrix) of the interpolant at the points specified in the xfile
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_getanisocoeff:
                cout << R"help(
Commands           Shorthand    Action
 -getanisotropy    -ga          estimates the anisotropic coefficients

Accepted options:
Options            Required     Value         Action
 -gridfile         yes          <filename>    set the name for the grid file
 -type             yes          <type>        set the type of anisotropic coefficients
 -refout           sometimes    <int>         select the output to use
                                              required by global grids only
 -outputfile       no           <filename>    set the name for the output file
 -print            no           <none>        print to standard output
Note: -outputfile or -print output the estimated anisotropic coefficients

)help";
                break;
            case command_refine_aniso:
                cout << R"help(
Commands             Shorthand    Action
 -refineaniso        -ra          refines the grid

Accepted options:
Options              Required     Value         Action
 -gridfile           yes          <filename>    set the name for the grid file
 -type               yes          <type>        set the type of anisotropic refinement
 -mingrowth          no           <int>         minimum number of new points (defaults to 1)
 -refout             sometimes    <int>         select the output to use for the refinement
                                                required by global grids, for sequence grids
                                                defaults to -1 (use all outputs)
 -levellimitsfile    no           <filename>    set the limits for the levels
 -outputfile         no           <filename>    set the name for the output file
 -print              no           <none>        print to standard output
 -ascii              <none>       use ASCII grid file format
Note: -outputfile or -print output the new points of the grid

)help";
                break;
            case command_refine_surp:
                cout << R"help(
Commands             Shorthand    Action
 -refinesurp         -rs          refines the grid

Accepted options:
Options              Required     Value     Action
 -gridfile           yes          <filename>    set the name for the grid file
 -tolerance          yes          <float>       set the tolerance for the refinement
 -reftype            sometimes    <int>         set the type of refinement
                                                required by local polynomial and wavelet grids
 -refout             sometimes    <int>         select the output to use for the refinement
                                                required by global grids, for sequence grids
                                                defaults to -1 (use all outputs)
 -levellimitsfile    no           <filename>    set the limits for the levels
 -valsfile           no           <filename>    set the correction weights for the surpluses
 -outputfile         no           <filename>    set the name for the output file
 -print              no           <none>        print to standard output
 -ascii                           <none>        use ASCII grid file format
Note: -outputfile or -print output the new points of the grid

)help";
                break;
            case command_refine:
                cout << R"help(
Commands      Shorthand    Action
 -refine      -r     refines the grid

 -refine calls -refineaniso for Global and Sequence grids and -refinesurp otherwise
 see "-refineaniso help" or "-refinesurp help" for the corresponding accepted options
Note: -outputfile or -print output the new points of the grid

)help";
                break;
            case command_refine_clear:
                cout << R"help(
Commands          Shorthand    Action
 -cancelrefine    -cr          discards the last refinement (unless values are already loaded)
Accepted options:
Options           Required     Value         Action
 -gridfile        yes          <filename>    set the name for the grid file
 -ascii                        <none>        use ASCII grid file format

)help";
                break;
            case command_refine_merge:
                cout << R"help(
Commands         Shorthand    Action
 -mergerefine    -mr          merges the loaded and needed points and discards any loaded values

Accepted options:
Options          Required     Value         Action
    -gridfile    yes          <filename>    set the name for the grid file
    -ascii       <none>       use ASCII grid file format

)help";
                break;
            case command_using_construct:
                cout << R"help(
Commands             Action
 -using-construct    writes short string indicating whether dynamic construction is on

Accepted options:
Options       Required     Value         Action
 -gridfile    yes          <filename>    set the name for the grid file
Note that 'tasgrid -using-construct <filename>' is also accepted

)help";
                break;
            case command_get_candidate_construction:
                cout << R"help(
Commands              Shorthand    Action
 -getconstructpnts    -gcp         get points for dynamic construction

Accepted options:
Options               Required     Value         Action
 -gridfile            yes          <filename>    set the name for the grid file
 -refout              sometimes    <int>         select the output to use for the refinement
 -anisotropyfile      sometimes    <filename>    set the anisotropic weights
 -levellimitsfile     no           <filename>    set the limits for the levels
 -outputfile          no           <filename>    set the name for the output file
 -print               no           <none>        print to standard output
 -ascii                            <none>        use ASCII grid file format

)help";
                break;
            case command_load_construction:
                cout << R"help(
Commands             Shorthand    Action
 -loadconstructed    -lcp         load points for dynamic construction

Accepted options:
Options              Required     Value         Action
 -gridfile           yes          <filename>    set the name for the grid file
 -xfile              yes          <filename>    set the name for the file with points
 -valsfile           yes          <filename>    set the name for the file with values

)help";
                break;
            case command_getpoly:
                cout << R"help(
Commands        Shorthand    Action
 -getpoly                    get polynomial space

Accepted options:
Options         Required     Value         Action
 -gridfile      yes          <filename>    set the name for the grid file
 -type          yes          <type>        specifies whether to use quadrature or interpolation
 -outputfile    no           <filename>    set the name for the output file
 -print         no           <none>        print to standard output
Note: -outputfile or -print output the polynomial indexes

)help";
                break;
            case command_summary:
                cout << R"help(
Commands      Shorthand    Action
 -summary     -s           writes short description

Accepted options:
Options       Required     Value         Action
 -gridfile    yes          <filename>    set the name for the grid file
Note that 'tasgrid -s <filename>' is also accepted

)help";
                break;
            case command_getpointsindex:
            case command_getneededindex:
                cout << R"help(
Commands              Action
 -getpointsindexes    returns the integer multi-index set of the points
 -getneededindexes    returns the integer multi-index set of the needed points
Note: these commands exist primarily for debugging purposes

Accepted options:
Options         Required     Value         Action
 -gridfile      yes          <filename>    set the name for the grid file
 -outputfile    no           <filename>    set the name for the output file
 -print         no           <none>        print to standard output
Note: -outputfile or -print derivative (Jacobian matrix) of the interpolant at the points specified in the xfile
Note: at least one of -outputfile or -print must be specified, otherwise the command has no output

)help";
                break;
            case command_none:
                throw std::runtime_error("ERROR: incorrect command for help");
        }
    }else if (ht == help_listtypes){
        cout << R"help(
This only lists the strings associated with each option for spelling purposes.
Refer to the manual for details about each type.

List of global grids types:
  level     curved     hyperbolic     tensor
  iptotal   ipcurved   iphyperbolic   iptensor
  qptotal   qpcurved   qphyperbolic   qptensor

List of global grids rules:
         chebyshev          chebyshev-odd    clenshaw-curtis   clenshaw-curtis-zero
              leja               leja-odd              rleja              rleja-odd
     rleja-double2          rleja-double4      rleja-shifted     rleja-shifted-even
      max-lebesgue       max-lebesgue-odd       min-lebesgue       min-lebesgue-odd
         min-delta          min-delta-odd             fejer2
    gauss-legendre     gauss-legendre-odd    gauss-patterson       custom-tabulated
  gauss-gegenbauer   gauss-gegenbauer-odd       gauss-jacobi       gauss-jacobi-odd
    gauss-laguerre     gauss-laguerre-odd      gauss-hermite      gauss-hermite-odd
  gauss-chebyshev1   gauss-chebyshev1-odd   gauss-chebyshev2   gauss-chebyshev2-odd

List of sequence grids rules:
              leja              rleja     rleja-shifted
      max-lebesgue       min-lebesgue         min-delta

List of local polynomial grids rules:
      localp    localp-zero    semi-localp   localp-boundary

List of local wavelet grids rules:
      wavelet

List of local polynomial and wavelet refinement types:
      classic     parents    direction    fds

List of conformal maps:
      asin

)help";
    }
}